

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall
ON_3dVector::Decompose
          (ON_3dVector *this,ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z,double *a,double *b,
          double *c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double d2;
  double pivot_ratio;
  double row0 [3];
  double row2 [3];
  double row1 [3];
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  local_90 = 0.0;
  local_88 = operator*(X,X);
  dVar2 = operator*(X,Y);
  local_80 = dVar2;
  dVar3 = operator*(X,Z);
  local_78 = dVar3;
  local_48 = dVar2;
  local_40 = operator*(Y,Y);
  local_60 = operator*(Y,Z);
  local_68 = dVar3;
  local_38 = local_60;
  local_58 = operator*(Z,Z);
  dVar2 = operator*(this,X);
  dVar3 = operator*(this,Y);
  d2 = operator*(this,Z);
  iVar1 = ON_Solve3x3(&local_88,&local_48,&local_68,dVar2,dVar3,d2,a,b,c,&local_90);
  return iVar1 == 3;
}

Assistant:

bool ON_3dVector::Decompose( // Computes a, b, c such that this vector = a*X + b*Y + c*Z
       //
       // If X,Y,Z is known to be an orthonormal frame,
       // then a = V*X, b = V*Y, c = V*Z will compute
       // the same result more quickly.
       const ON_3dVector& X,
       const ON_3dVector& Y,
       const ON_3dVector& Z,
       double* a,
       double* b,
       double* c
       ) const
{
  int rank;
  double pivot_ratio = 0.0;
  double row0[3], row1[3], row2[3];
  row0[0] = X*X;   row0[1] = X*Y;   row0[2] = X*Z;
  row1[0] = row0[1]; row1[1] = Y*Y;   row1[2] = Y*Z;
  row2[0] = row0[2]; row2[1] = row1[2]; row2[2] = Z*Z;
  rank = ON_Solve3x3( row0, row1, row2, 
                    (*this)*X, (*this)*Y, (*this)*Z,
                    a, b, c, &pivot_ratio );
  return (rank == 3) ? true : false;
}